

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.h
# Opt level: O0

void __thiscall node::PSBTAnalysis::SetInvalid(PSBTAnalysis *this,string *err_msg)

{
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  vector<node::PSBTInputAnalysis,_std::allocator<node::PSBTInputAnalysis>_>
  *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::optional<unsigned_long>::operator=();
  std::optional<CFeeRate>::operator=((optional<CFeeRate> *)&in_RDI->field_2);
  std::optional<long>::operator=((optional<long> *)(in_RDI + 1));
  std::vector<node::PSBTInputAnalysis,_std::allocator<node::PSBTInputAnalysis>_>::clear
            (in_stack_ffffffffffffffc8);
  *(undefined4 *)&in_RDI[2]._M_string_length = 0;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (in_RSI,in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SetInvalid(std::string err_msg)
    {
        estimated_vsize = std::nullopt;
        estimated_feerate = std::nullopt;
        fee = std::nullopt;
        inputs.clear();
        next = PSBTRole::CREATOR;
        error = err_msg;
    }